

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::
UnaryExpr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*const_&>::
streamReconstructedExpression
          (UnaryExpr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*const_&>
           *this,ostream *os)

{
  ostream *in_RSI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **in_stack_ffffffffffffffa8;
  string local_30 [48];
  
  Detail::stringify<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>*>
            (in_stack_ffffffffffffffa8);
  std::operator<<(in_RSI,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }